

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O1

uint32_t rebuild_hflags_a32(CPUARMState_conflict *env,int fp_el,ARMMMUIdx mmu_idx)

{
  ulong uVar1;
  ARMMMUIdx AVar2;
  uint uVar3;
  uint32_t uVar4;
  uint64_t uVar5;
  ARMMMUIdx flags;
  ARMMMUIdx mmu_idx_00;
  ulong uVar6;
  bool bVar7;
  
  AVar2 = rebuild_hflags_aprofile(env);
  uVar1 = env->features;
  flags = (ARMMMUIdx)uVar1 & 0x10000000;
  uVar6 = 0;
  if ((uVar1 & 0x200000000) == 0) {
    uVar6 = (ulong)(flags >> 0x1c);
  }
  if ((~uVar1 & 0x210000000) == 0) {
    uVar6 = (ulong)((uint)(env->cp15).scr_el3 >> 10);
  }
  if (((uVar1 >> 0x20 & 1) != 0) &&
     (((uVar1 & 0x200000000) == 0 || (((env->cp15).scr_el3 & 1) != 0)))) {
    if ((uVar6 & 1) == 0) {
      uVar6 = 0;
    }
    else {
      uVar6 = (env->cp15).hcr_el2 >> 0x1f;
    }
  }
  mmu_idx_00 = AVar2 | 0x4000;
  if ((uVar6 & 1) == 0) {
    mmu_idx_00 = AVar2;
  }
  if (((ARMMMUIdx)uVar1 >> 9 & 1) == 0) {
    if (env->aarch64 == 0) {
      uVar3 = env->uncached_cpsr & 0x1f;
      if (uVar3 == 0x10) {
        uVar3 = 0;
      }
      else if (uVar3 == 0x16) {
        uVar3 = 3;
      }
      else if (uVar3 == 0x1a) {
        uVar3 = 2;
      }
      else {
        if ((uVar1 & 0x200000000) != 0) {
          bVar7 = uVar3 == 0x16;
          if (!bVar7) {
            bVar7 = ((env->cp15).scr_el3 & 1) == 0;
          }
          if (((uVar1 & 0x10000000) == 0) && (uVar3 = 3, bVar7)) goto LAB_0061dbb6;
        }
        uVar3 = 1;
      }
    }
    else {
      uVar3 = env->pstate >> 2 & 3;
    }
  }
  else {
    uVar3 = 1;
    if ((env->v7m).exception == 0) {
      uVar3 = ~(env->v7m).control[(env->v7m).secure] & 1;
    }
  }
LAB_0061dbb6:
  if ((uVar3 < 2) && ((env->cp15).hstr_el2 != 0)) {
    uVar5 = arm_hcr_el2_eff_aarch64(env);
    flags = mmu_idx_00 | 0x10000;
    if ((~uVar5 & 0x408000000) != 0) {
      mmu_idx_00 = flags;
    }
  }
  uVar4 = rebuild_hflags_common_32(env,fp_el,mmu_idx_00,flags);
  return uVar4;
}

Assistant:

static uint32_t rebuild_hflags_a32(CPUARMState *env, int fp_el,
                                   ARMMMUIdx mmu_idx)
{
    uint32_t flags = rebuild_hflags_aprofile(env);

    if (arm_el_is_aa64(env, 1)) {
        FIELD_DP32(flags, TBFLAG_A32, VFPEN, 1, flags);
    }

    if (arm_current_el(env) < 2 && env->cp15.hstr_el2 &&
        (arm_hcr_el2_eff(env) & (HCR_E2H | HCR_TGE)) != (HCR_E2H | HCR_TGE)) {
        FIELD_DP32(flags, TBFLAG_A32, HSTR_ACTIVE, 1, flags);
    }

    return rebuild_hflags_common_32(env, fp_el, mmu_idx, flags);
}